

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedTimeZone::countTransitionRules(RuleBasedTimeZone *this,UErrorCode *param_1)

{
  int iVar1;
  
  if (this->fHistoricRules == (UVector *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = this->fHistoricRules->count;
  }
  if (this->fFinalRules != (UVector *)0x0) {
    iVar1 = iVar1 + this->fFinalRules->count;
  }
  return iVar1;
}

Assistant:

int32_t
RuleBasedTimeZone::countTransitionRules(UErrorCode& /*status*/) const {
    int32_t count = 0;
    if (fHistoricRules != NULL) {
        count += fHistoricRules->size();
    }
    if (fFinalRules != NULL) {
        count += fFinalRules->size();
    }
    return count;
}